

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vertexClustering.cpp
# Opt level: O0

bool __thiscall VCCluster::removeUnconnected(VCCluster *this,VCCluster *cNull)

{
  value_type psVar1;
  bool bVar2;
  undefined8 *puVar3;
  size_type sVar4;
  reference ppsVar5;
  reference ppsVar6;
  VCFace *item;
  iterator __end3;
  iterator __begin3;
  set<VCFace_*,_std::less<VCFace_*>,_std::allocator<VCFace_*>_> *__range3;
  set<VCFace_*,_std::less<VCFace_*>,_std::allocator<VCFace_*>_> *s;
  iterator __end1;
  iterator __begin1;
  vector<std::set<VCFace_*,_std::less<VCFace_*>,_std::allocator<VCFace_*>_>_*,_std::allocator<std::set<VCFace_*,_std::less<VCFace_*>,_std::allocator<VCFace_*>_>_*>_>
  *__range1;
  set<VCFace_*,_std::less<VCFace_*>,_std::allocator<VCFace_*>_> *largest;
  set<VCFace_*,_std::less<VCFace_*>,_std::allocator<VCFace_*>_> *comp;
  set<VCFace_*,_std::less<VCFace_*>,_std::allocator<VCFace_*>_> unvisited;
  vector<std::set<VCFace_*,_std::less<VCFace_*>,_std::allocator<VCFace_*>_>_*,_std::allocator<std::set<VCFace_*,_std::less<VCFace_*>,_std::allocator<VCFace_*>_>_*>_>
  components;
  VCFace *in_stack_fffffffffffffec8;
  VCCluster *in_stack_fffffffffffffed0;
  set<VCFace_*,_std::less<VCFace_*>,_std::allocator<VCFace_*>_> *psVar7;
  value_type *in_stack_fffffffffffffed8;
  vector<std::set<VCFace_*,_std::less<VCFace_*>,_std::allocator<VCFace_*>_>_*,_std::allocator<std::set<VCFace_*,_std::less<VCFace_*>,_std::allocator<VCFace_*>_>_*>_>
  *in_stack_fffffffffffffee0;
  _Self local_e8;
  _Self local_e0;
  set<VCFace_*,_std::less<VCFace_*>,_std::allocator<VCFace_*>_> *local_d8;
  set<VCFace_*,_std::less<VCFace_*>,_std::allocator<VCFace_*>_> *local_d0;
  set<VCFace_*,_std::less<VCFace_*>,_std::allocator<VCFace_*>_> **local_c8;
  __normal_iterator<std::set<VCFace_*,_std::less<VCFace_*>,_std::allocator<VCFace_*>_>_**,_std::vector<std::set<VCFace_*,_std::less<VCFace_*>,_std::allocator<VCFace_*>_>_*,_std::allocator<std::set<VCFace_*,_std::less<VCFace_*>,_std::allocator<VCFace_*>_>_*>_>_>
  local_c0;
  vector<std::set<VCFace_*,_std::less<VCFace_*>,_std::allocator<VCFace_*>_>_*,_std::allocator<std::set<VCFace_*,_std::less<VCFace_*>,_std::allocator<VCFace_*>_>_*>_>
  *local_b8;
  set<VCFace_*,_std::less<VCFace_*>,_std::allocator<VCFace_*>_> **local_a8;
  set<VCFace_*,_std::less<VCFace_*>,_std::allocator<VCFace_*>_> **local_a0;
  __normal_iterator<std::set<VCFace_*,_std::less<VCFace_*>,_std::allocator<VCFace_*>_>_**,_std::vector<std::set<VCFace_*,_std::less<VCFace_*>,_std::allocator<VCFace_*>_>_*,_std::allocator<std::set<VCFace_*,_std::less<VCFace_*>,_std::allocator<VCFace_*>_>_*>_>_>
  local_98;
  set<VCFace_*,_std::less<VCFace_*>,_std::allocator<VCFace_*>_> *local_90;
  undefined4 local_84;
  _Base_ptr local_80;
  undefined8 *local_78;
  set<VCFace_*,_std::less<VCFace_*>,_std::allocator<VCFace_*>_> *in_stack_ffffffffffffffa8;
  set<VCFace_*,_std::less<VCFace_*>,_std::allocator<VCFace_*>_> *in_stack_ffffffffffffffb0;
  VCFace *in_stack_ffffffffffffffb8;
  VCCluster *in_stack_ffffffffffffffc0;
  vector<std::set<VCFace_*,_std::less<VCFace_*>,_std::allocator<VCFace_*>_>_*,_std::allocator<std::set<VCFace_*,_std::less<VCFace_*>,_std::allocator<VCFace_*>_>_*>_>
  local_30;
  byte local_1;
  
  std::
  vector<std::set<VCFace_*,_std::less<VCFace_*>,_std::allocator<VCFace_*>_>_*,_std::allocator<std::set<VCFace_*,_std::less<VCFace_*>,_std::allocator<VCFace_*>_>_*>_>
  ::vector((vector<std::set<VCFace_*,_std::less<VCFace_*>,_std::allocator<VCFace_*>_>_*,_std::allocator<std::set<VCFace_*,_std::less<VCFace_*>,_std::allocator<VCFace_*>_>_*>_>
            *)0x27de01);
  std::set<VCFace_*,_std::less<VCFace_*>,_std::allocator<VCFace_*>_>::set
            ((set<VCFace_*,_std::less<VCFace_*>,_std::allocator<VCFace_*>_> *)
             in_stack_fffffffffffffed0,
             (set<VCFace_*,_std::less<VCFace_*>,_std::allocator<VCFace_*>_> *)
             in_stack_fffffffffffffec8);
  while (bVar2 = std::set<VCFace_*,_std::less<VCFace_*>,_std::allocator<VCFace_*>_>::empty
                           ((set<VCFace_*,_std::less<VCFace_*>,_std::allocator<VCFace_*>_> *)
                            0x27de28), ((bVar2 ^ 0xffU) & 1) != 0) {
    puVar3 = (undefined8 *)operator_new(0x30);
    puVar3[4] = 0;
    puVar3[5] = 0;
    puVar3[2] = 0;
    puVar3[3] = 0;
    *puVar3 = 0;
    puVar3[1] = 0;
    std::set<VCFace_*,_std::less<VCFace_*>,_std::allocator<VCFace_*>_>::set
              ((set<VCFace_*,_std::less<VCFace_*>,_std::allocator<VCFace_*>_> *)0x27de5c);
    local_78 = puVar3;
    local_80 = (_Base_ptr)
               std::set<VCFace_*,_std::less<VCFace_*>,_std::allocator<VCFace_*>_>::begin
                         ((set<VCFace_*,_std::less<VCFace_*>,_std::allocator<VCFace_*>_> *)
                          in_stack_fffffffffffffec8);
    std::_Rb_tree_const_iterator<VCFace_*>::operator*((_Rb_tree_const_iterator<VCFace_*> *)0x27de90)
    ;
    bfs(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0,
        in_stack_ffffffffffffffa8);
    std::
    vector<std::set<VCFace_*,_std::less<VCFace_*>,_std::allocator<VCFace_*>_>_*,_std::allocator<std::set<VCFace_*,_std::less<VCFace_*>,_std::allocator<VCFace_*>_>_*>_>
    ::push_back(in_stack_fffffffffffffee0,in_stack_fffffffffffffed8);
  }
  sVar4 = std::
          vector<std::set<VCFace_*,_std::less<VCFace_*>,_std::allocator<VCFace_*>_>_*,_std::allocator<std::set<VCFace_*,_std::less<VCFace_*>,_std::allocator<VCFace_*>_>_*>_>
          ::size(&local_30);
  if (sVar4 < 2) {
    sVar4 = std::
            vector<std::set<VCFace_*,_std::less<VCFace_*>,_std::allocator<VCFace_*>_>_*,_std::allocator<std::set<VCFace_*,_std::less<VCFace_*>,_std::allocator<VCFace_*>_>_*>_>
            ::size(&local_30);
    if (sVar4 == 1) {
      ppsVar5 = std::
                vector<std::set<VCFace_*,_std::less<VCFace_*>,_std::allocator<VCFace_*>_>_*,_std::allocator<std::set<VCFace_*,_std::less<VCFace_*>,_std::allocator<VCFace_*>_>_*>_>
                ::operator[](&local_30,0);
      psVar1 = *ppsVar5;
      if (psVar1 != (value_type)0x0) {
        std::set<VCFace_*,_std::less<VCFace_*>,_std::allocator<VCFace_*>_>::~set
                  ((set<VCFace_*,_std::less<VCFace_*>,_std::allocator<VCFace_*>_> *)0x27df56);
        operator_delete(psVar1);
      }
    }
    local_1 = 0;
  }
  else {
    in_stack_fffffffffffffee0 = &local_30;
    local_a0 = (set<VCFace_*,_std::less<VCFace_*>,_std::allocator<VCFace_*>_> **)
               std::
               vector<std::set<VCFace_*,_std::less<VCFace_*>,_std::allocator<VCFace_*>_>_*,_std::allocator<std::set<VCFace_*,_std::less<VCFace_*>,_std::allocator<VCFace_*>_>_*>_>
               ::begin((vector<std::set<VCFace_*,_std::less<VCFace_*>,_std::allocator<VCFace_*>_>_*,_std::allocator<std::set<VCFace_*,_std::less<VCFace_*>,_std::allocator<VCFace_*>_>_*>_>
                        *)in_stack_fffffffffffffec8);
    local_a8 = (set<VCFace_*,_std::less<VCFace_*>,_std::allocator<VCFace_*>_> **)
               std::
               vector<std::set<VCFace_*,_std::less<VCFace_*>,_std::allocator<VCFace_*>_>_*,_std::allocator<std::set<VCFace_*,_std::less<VCFace_*>,_std::allocator<VCFace_*>_>_*>_>
               ::end((vector<std::set<VCFace_*,_std::less<VCFace_*>,_std::allocator<VCFace_*>_>_*,_std::allocator<std::set<VCFace_*,_std::less<VCFace_*>,_std::allocator<VCFace_*>_>_*>_>
                      *)in_stack_fffffffffffffec8);
    local_98 = std::
               max_element<__gnu_cxx::__normal_iterator<std::set<VCFace*,std::less<VCFace*>,std::allocator<VCFace*>>**,std::vector<std::set<VCFace*,std::less<VCFace*>,std::allocator<VCFace*>>*,std::allocator<std::set<VCFace*,std::less<VCFace*>,std::allocator<VCFace*>>*>>>,VCCluster::removeUnconnected(VCCluster*)::__0>
                         (local_a0,local_a8);
    ppsVar6 = __gnu_cxx::
              __normal_iterator<std::set<VCFace_*,_std::less<VCFace_*>,_std::allocator<VCFace_*>_>_**,_std::vector<std::set<VCFace_*,_std::less<VCFace_*>,_std::allocator<VCFace_*>_>_*,_std::allocator<std::set<VCFace_*,_std::less<VCFace_*>,_std::allocator<VCFace_*>_>_*>_>_>
              ::operator*(&local_98);
    local_90 = *ppsVar6;
    local_b8 = &local_30;
    local_c0._M_current =
         (set<VCFace_*,_std::less<VCFace_*>,_std::allocator<VCFace_*>_> **)
         std::
         vector<std::set<VCFace_*,_std::less<VCFace_*>,_std::allocator<VCFace_*>_>_*,_std::allocator<std::set<VCFace_*,_std::less<VCFace_*>,_std::allocator<VCFace_*>_>_*>_>
         ::begin((vector<std::set<VCFace_*,_std::less<VCFace_*>,_std::allocator<VCFace_*>_>_*,_std::allocator<std::set<VCFace_*,_std::less<VCFace_*>,_std::allocator<VCFace_*>_>_*>_>
                  *)in_stack_fffffffffffffec8);
    local_c8 = (set<VCFace_*,_std::less<VCFace_*>,_std::allocator<VCFace_*>_> **)
               std::
               vector<std::set<VCFace_*,_std::less<VCFace_*>,_std::allocator<VCFace_*>_>_*,_std::allocator<std::set<VCFace_*,_std::less<VCFace_*>,_std::allocator<VCFace_*>_>_*>_>
               ::end((vector<std::set<VCFace_*,_std::less<VCFace_*>,_std::allocator<VCFace_*>_>_*,_std::allocator<std::set<VCFace_*,_std::less<VCFace_*>,_std::allocator<VCFace_*>_>_*>_>
                      *)in_stack_fffffffffffffec8);
    while (bVar2 = __gnu_cxx::operator!=
                             ((__normal_iterator<std::set<VCFace_*,_std::less<VCFace_*>,_std::allocator<VCFace_*>_>_**,_std::vector<std::set<VCFace_*,_std::less<VCFace_*>,_std::allocator<VCFace_*>_>_*,_std::allocator<std::set<VCFace_*,_std::less<VCFace_*>,_std::allocator<VCFace_*>_>_*>_>_>
                               *)in_stack_fffffffffffffed0,
                              (__normal_iterator<std::set<VCFace_*,_std::less<VCFace_*>,_std::allocator<VCFace_*>_>_**,_std::vector<std::set<VCFace_*,_std::less<VCFace_*>,_std::allocator<VCFace_*>_>_*,_std::allocator<std::set<VCFace_*,_std::less<VCFace_*>,_std::allocator<VCFace_*>_>_*>_>_>
                               *)in_stack_fffffffffffffec8), bVar2) {
      ppsVar6 = __gnu_cxx::
                __normal_iterator<std::set<VCFace_*,_std::less<VCFace_*>,_std::allocator<VCFace_*>_>_**,_std::vector<std::set<VCFace_*,_std::less<VCFace_*>,_std::allocator<VCFace_*>_>_*,_std::allocator<std::set<VCFace_*,_std::less<VCFace_*>,_std::allocator<VCFace_*>_>_*>_>_>
                ::operator*(&local_c0);
      local_d0 = *ppsVar6;
      if (local_d0 != local_90) {
        local_d8 = local_d0;
        local_e0._M_node =
             (_Base_ptr)
             std::set<VCFace_*,_std::less<VCFace_*>,_std::allocator<VCFace_*>_>::begin
                       ((set<VCFace_*,_std::less<VCFace_*>,_std::allocator<VCFace_*>_> *)
                        in_stack_fffffffffffffec8);
        local_e8._M_node =
             (_Base_ptr)
             std::set<VCFace_*,_std::less<VCFace_*>,_std::allocator<VCFace_*>_>::end
                       ((set<VCFace_*,_std::less<VCFace_*>,_std::allocator<VCFace_*>_> *)
                        in_stack_fffffffffffffec8);
        while (bVar2 = std::operator!=(&local_e0,&local_e8), bVar2) {
          std::_Rb_tree_const_iterator<VCFace_*>::operator*
                    ((_Rb_tree_const_iterator<VCFace_*> *)0x27e09f);
          giveItem(in_stack_fffffffffffffed0,in_stack_fffffffffffffec8,(VCCluster *)0x27e0be);
          std::_Rb_tree_const_iterator<VCFace_*>::operator++
                    ((_Rb_tree_const_iterator<VCFace_*> *)in_stack_fffffffffffffed0);
        }
        if (local_d0 != (set<VCFace_*,_std::less<VCFace_*>,_std::allocator<VCFace_*>_> *)0x0) {
          psVar7 = local_d0;
          std::set<VCFace_*,_std::less<VCFace_*>,_std::allocator<VCFace_*>_>::~set
                    ((set<VCFace_*,_std::less<VCFace_*>,_std::allocator<VCFace_*>_> *)0x27e0e8);
          operator_delete(psVar7);
        }
      }
      __gnu_cxx::
      __normal_iterator<std::set<VCFace_*,_std::less<VCFace_*>,_std::allocator<VCFace_*>_>_**,_std::vector<std::set<VCFace_*,_std::less<VCFace_*>,_std::allocator<VCFace_*>_>_*,_std::allocator<std::set<VCFace_*,_std::less<VCFace_*>,_std::allocator<VCFace_*>_>_*>_>_>
      ::operator++(&local_c0);
    }
    if (local_90 != (set<VCFace_*,_std::less<VCFace_*>,_std::allocator<VCFace_*>_> *)0x0) {
      psVar7 = local_90;
      std::set<VCFace_*,_std::less<VCFace_*>,_std::allocator<VCFace_*>_>::~set
                ((set<VCFace_*,_std::less<VCFace_*>,_std::allocator<VCFace_*>_> *)0x27e122);
      operator_delete(psVar7);
    }
    local_1 = 1;
  }
  local_84 = 1;
  std::set<VCFace_*,_std::less<VCFace_*>,_std::allocator<VCFace_*>_>::~set
            ((set<VCFace_*,_std::less<VCFace_*>,_std::allocator<VCFace_*>_> *)0x27e14c);
  std::
  vector<std::set<VCFace_*,_std::less<VCFace_*>,_std::allocator<VCFace_*>_>_*,_std::allocator<std::set<VCFace_*,_std::less<VCFace_*>,_std::allocator<VCFace_*>_>_*>_>
  ::~vector(in_stack_fffffffffffffee0);
  return (bool)(local_1 & 1);
}

Assistant:

bool VCCluster::removeUnconnected(VCCluster* cNull) {
	vector< set<VCFace*> * > components;
	set<VCFace*> unvisited(items);
	while (!unvisited.empty()) {
		set<VCFace*>* comp = new set<VCFace*>();
		bfs(*unvisited.begin(), comp, &unvisited);
		components.push_back(comp);
	}
	if (components.size() <= 1) {
		if(components.size() == 1)
			delete components[0];
		return false;
	}
	set<VCFace*>* largest = *max_element(components.begin(), components.end(),
		[](set<VCFace*> * s1, set<VCFace*> * s2) -> bool { return s1->size() < s2->size(); });
	for (set<VCFace*>* s : components) {
		if (s != largest) {
			for (VCFace* item : *s) {
				giveItem(item, cNull);
			}
			delete s;
		}
	}
	delete largest;
	return true;
}